

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  Vdbe *pVVar4;
  int iVar5;
  int rc;
  int iVar6;
  Vdbe *pVm;
  uchar *puVar7;
  Mem *pMVar8;
  char **p;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  char **local_78;
  Vdbe *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (Vdbe *)0x0;
  iVar5 = sqlite3SafetyCheckOk(db);
  if (iVar5 == 0) {
    iVar5 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x21835,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    pcVar10 = "";
    if (zSql != (char *)0x0) {
      pcVar10 = zSql;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errCode = 0;
    if (db->pErr == (sqlite3_value *)0x0) {
      db->errByteOffset = -1;
    }
    else {
      sqlite3ErrorFinish(db,0);
    }
    p = (char **)0x0;
    do {
      if (*pcVar10 == '\0') {
        rc = 0;
        break;
      }
      local_48 = (Vdbe *)0x0;
      rc = sqlite3LockAndPrepare
                     (db,pcVar10,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_48,&local_40);
      iVar6 = 2;
      if (rc == 0) {
        if (local_48 == (Vdbe *)0x0) {
          rc = 0;
          pcVar10 = local_40;
        }
        else {
          bVar3 = false;
          uVar11 = 0;
          local_78 = (char **)0x0;
          do {
            rc = sqlite3_step((sqlite3_stmt *)local_48);
            if (xCallback == (sqlite3_callback)0x0) {
LAB_00122bb1:
              if (rc == 100) {
                iVar6 = 0;
                rc = 100;
              }
              else {
                rc = sqlite3VdbeFinalize(local_48);
                local_48 = (Vdbe *)0x0;
                pcVar10 = local_40 + -1;
                do {
                  pbVar1 = (byte *)(pcVar10 + 1);
                  pcVar10 = pcVar10 + 1;
                } while ((""[*pbVar1] & 1) != 0);
                iVar6 = 5;
              }
            }
            else {
              if (rc != 100) {
                if (rc == 0x65 && !bVar3) {
                  if ((db->flags & 0x100) != 0) goto LAB_00122a5a;
                  bVar3 = false;
                }
                goto LAB_00122bb1;
              }
LAB_00122a5a:
              if (bVar3) {
LAB_00122a66:
                if (rc == 100) {
                  local_78 = p + uVar11;
                  if ((int)uVar11 == 0) {
                    uVar12 = 0;
                  }
                  else {
                    uVar12 = 0;
                    do {
                      puVar7 = sqlite3_column_text((sqlite3_stmt *)local_48,(int)uVar12);
                      pVVar4 = local_48;
                      local_78[uVar12] = (char *)puVar7;
                      if (puVar7 == (uchar *)0x0) {
                        pMVar8 = columnMem((sqlite3_stmt *)local_48,(int)uVar12);
                        uVar2._0_2_ = pMVar8->flags;
                        uVar2._2_1_ = pMVar8->enc;
                        uVar2._3_1_ = pMVar8->eSubtype;
                        columnMallocFailure((sqlite3_stmt *)pVVar4);
                        if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
                          sqlite3OomFault(db);
                          iVar6 = 6;
                          bVar3 = true;
                          rc = 100;
                          goto LAB_00122bf0;
                        }
                      }
                      uVar12 = uVar12 + 1;
                    } while (uVar11 != uVar12);
                  }
                  local_78[uVar12] = (char *)0x0;
                }
                iVar5 = (*xCallback)(pArg,(int)uVar11,local_78,p);
                if (iVar5 == 0) {
                  bVar3 = true;
                  goto LAB_00122bb1;
                }
                sqlite3VdbeFinalize(local_48);
                local_48 = (Vdbe *)0x0;
                db->errCode = 4;
                sqlite3ErrorFinish(db,4);
                rc = 4;
                iVar6 = 6;
                bVar3 = true;
              }
              else {
                if (local_48 == (Vdbe *)0x0) {
                  uVar11 = 0;
                }
                else {
                  uVar11 = (ulong)local_48->nResColumn;
                }
                uVar12 = (ulong)((int)uVar11 << 4 | 8);
                if (db == (sqlite3 *)0x0) {
                  p = (char **)sqlite3Malloc(uVar12);
                }
                else {
                  p = (char **)sqlite3DbMallocRawNN(db,uVar12);
                }
                pVVar4 = local_48;
                if (p != (char **)0x0) {
                  if ((int)uVar11 != 0) {
                    uVar12 = 0;
                    do {
                      pcVar9 = (char *)columnName((sqlite3_stmt *)pVVar4,(int)uVar12,0,0);
                      p[uVar12] = pcVar9;
                      uVar12 = uVar12 + 1;
                    } while (uVar11 != uVar12);
                  }
                  goto LAB_00122a66;
                }
                iVar6 = 6;
                p = (char **)0x0;
                bVar3 = false;
              }
            }
LAB_00122bf0:
          } while (iVar6 == 0);
          if (iVar6 == 5) {
            if (p != (char **)0x0) {
              sqlite3DbFreeNN(db,p);
            }
            p = (char **)0x0;
            iVar6 = 0;
          }
        }
      }
      iVar5 = (int)&local_40;
      if ((iVar6 != 0) && (iVar6 != 2)) {
        if (iVar6 != 6) goto LAB_00122d94;
        break;
      }
    } while (rc == 0);
    if (local_48 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_48);
    }
    if (p != (char **)0x0) {
      sqlite3DbFreeNN(db,p);
    }
    if ((rc != 0) || (iVar5 = 0, db->mallocFailed != '\0')) {
      iVar5 = apiHandleError(db,rc);
    }
    if ((pzErrMsg == (char **)0x0) || (iVar5 == 0)) {
      if (pzErrMsg != (char **)0x0) {
        *pzErrMsg = (char *)0x0;
      }
    }
    else {
      pcVar10 = sqlite3_errmsg(db);
      pcVar10 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar10);
      *pzErrMsg = pcVar10;
      if (pcVar10 == (char *)0x0) {
        db->errCode = 7;
        iVar5 = 7;
        sqlite3ErrorFinish(db,7);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
LAB_00122d94:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc ||
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}